

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_measurement *
units::measurement_from_string
          (precise_measurement *__return_storage_ptr__,string *measurement_string,
          uint64_t match_flags)

{
  size_type sVar1;
  size_t sVar2;
  bool bVar3;
  ulong match_flags_00;
  double dVar4;
  precise_unit pVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring;
  size_t loc;
  precise_measurement mstr;
  string local_a0;
  string local_80;
  precise_unit c;
  string local_50;
  
  if (measurement_string->_M_string_length == 0) {
    __return_storage_ptr__->value_ = 0.0;
    (__return_storage_ptr__->units_).multiplier_ = 1.0;
    (__return_storage_ptr__->units_).base_units_ = (unit_data)0x0;
    (__return_storage_ptr__->units_).commodity_ = 0;
    return __return_storage_ptr__;
  }
  match_flags_00 = match_flags & 0xffffffefffffffff;
  cleanUnitString(measurement_string,match_flags_00);
  loc = 0;
  dVar4 = generateLeadingNumber(measurement_string,&loc);
  if (loc == 0) {
    dVar4 = readNumericalWords(measurement_string,&loc);
  }
  sVar2 = loc;
  if (loc == 0) {
    dVar4 = 1.0;
  }
  if (measurement_string->_M_string_length <= loc) {
    __return_storage_ptr__->value_ = dVar4;
    (__return_storage_ptr__->units_).multiplier_ = (double)0x3ff0000000000000;
    (__return_storage_ptr__->units_).base_units_ = (unit_data)0x0;
    (__return_storage_ptr__->units_).commodity_ = 0;
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)&ustring,(ulong)measurement_string);
  bVar3 = checkValidUnitString(&ustring,match_flags_00);
  sVar1 = ustring._M_string_length;
  if (bVar3) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ustring._M_dataplus._M_p == &ustring.field_2) {
      local_a0.field_2._8_8_ = ustring.field_2._8_8_;
    }
    else {
      local_a0._M_dataplus._M_p = ustring._M_dataplus._M_p;
    }
    ustring._M_string_length = 0;
    local_a0._M_string_length = sVar1;
    ustring.field_2._M_local_buf[0] = '\0';
    ustring._M_dataplus._M_p = (pointer)&ustring.field_2;
    pVar5 = unit_from_string_internal(&local_a0,match_flags | 0x1000000000);
    std::__cxx11::string::~string((string *)&local_a0);
    if (pVar5.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar5.multiplier_)) {
      if ((sVar2 == 0) && (pVar5.base_units_ == (unit_data)0x1000000)) {
        __return_storage_ptr__->value_ = pVar5.multiplier_;
        (__return_storage_ptr__->units_).multiplier_ = 1.0;
        (__return_storage_ptr__->units_).base_units_ = (unit_data)0x1000000;
        (__return_storage_ptr__->units_).commodity_ = pVar5.commodity_;
      }
      else {
        __return_storage_ptr__->value_ = dVar4;
        __return_storage_ptr__->units_ = pVar5;
      }
      goto LAB_001489a6;
    }
  }
  if (sVar2 == 0) {
    std::__cxx11::string::substr((ulong)&mstr,(ulong)measurement_string);
    c = get_unit((string *)&mstr,match_flags_00);
    std::__cxx11::string::~string((string *)&mstr);
    bVar3 = precise_unit::operator==(&c,(precise_unit *)precise::currency);
    if (bVar3) {
      std::__cxx11::string::substr((ulong)&local_80,(ulong)measurement_string);
      measurement_from_string(&mstr,&local_80,match_flags_00);
      std::__cxx11::string::~string((string *)&local_80);
      precise_measurement::operator*(__return_storage_ptr__,&mstr,&c);
      goto LAB_001489a6;
    }
  }
  std::__cxx11::string::string((string *)&local_50,(string *)measurement_string);
  pVar5 = unit_from_string_internal(&local_50,match_flags | 0x1000000000);
  std::__cxx11::string::~string((string *)&local_50);
  if (((undefined1  [16])pVar5 & (undefined1  [16])0xfffffff) == (undefined1  [16])0x0 ||
      pVar5.base_units_ == (unit_data)0xfa94a488 && NAN(pVar5.multiplier_)) {
    __return_storage_ptr__->value_ = dVar4;
    (__return_storage_ptr__->units_).multiplier_ = NAN;
    (__return_storage_ptr__->units_).base_units_ = (unit_data)0xfa94a488;
    (__return_storage_ptr__->units_).commodity_ = 0;
  }
  else {
    __return_storage_ptr__->value_ = 1.0;
    __return_storage_ptr__->units_ = pVar5;
  }
LAB_001489a6:
  std::__cxx11::string::~string((string *)&ustring);
  return __return_storage_ptr__;
}

Assistant:

precise_measurement measurement_from_string(
    std::string measurement_string,
    std::uint64_t match_flags)
{
    if (measurement_string.empty()) {
        return {};
    }
    // do a cleaning first to get rid of spaces and other issues
    match_flags &= (~skip_code_replacements);
    cleanUnitString(measurement_string, match_flags);

    size_t loc{0};
    auto val = generateLeadingNumber(measurement_string, loc);
    if (loc == 0) {
        val = readNumericalWords(measurement_string, loc);
    }
    if (loc == 0) {
        val = 1.0;
    }
    if (loc >= measurement_string.length()) {
        return {val, precise::one};
    }
    bool checkCurrency = (loc == 0);
    auto ustring = measurement_string.substr(loc);
    auto validString = checkValidUnitString(ustring, match_flags);
    auto un = (validString) ?
        unit_from_string_internal(
            std::move(ustring), match_flags | skip_code_replacements) :
        precise::invalid;
    if (!is_error(un)) {
        if (checkCurrency) {
            if (un.base_units() == precise::currency.base_units()) {
                return {
                    un.multiplier(),
                    precise_unit(1.0, precise::currency, un.commodity())};
            }
        }
        return {val, un};
    }
    if (checkCurrency) {
        auto c = get_unit(measurement_string.substr(0, 1), match_flags);
        if (c == precise::currency) {
            auto mstr = measurement_from_string(
                measurement_string.substr(1), match_flags);
            return mstr * c;
        }
    }

    // deal with some specifics
    /*
    if (measurement_string[loc] == '\'')
    {
        double v2 = std::stod(measurement_string.substr(loc + 1), &loc);
        if (measurement_string[loc] == '"')
        {
            return precise_measurement(val, precise::ft) +
    precise_measurement(v2, precise::in);
        }
    }
    */
    auto unit = unit_from_string_internal(
        std::move(measurement_string), match_flags | skip_code_replacements);
    if (is_valid(unit) && !unit.has_same_base(one.base_units())) {
        return {1.0, unit};
    }
    return {val, precise::invalid};
}